

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall picojson::default_parse_context::set_null(default_parse_context *this)

{
  value local_20;
  default_parse_context *local_10;
  default_parse_context *this_local;
  
  local_10 = this;
  picojson::value::value(&local_20);
  picojson::value::operator=(this->out_,&local_20);
  picojson::value::~value(&local_20);
  return true;
}

Assistant:

bool set_null() {
      *out_ = value();
      return true;
    }